

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>::
AdapterPromiseNode<kj::Canceler&,kj::Promise<void>>
          (AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>> *this,Canceler *params,
          Promise<void> *params_1)

{
  Canceler *canceler;
  Promise<void> *pPVar1;
  Promise<void> local_30;
  Promise<void> *local_20;
  Promise<void> *params_local_1;
  Canceler *params_local;
  AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_> *this_local;
  
  local_20 = params_1;
  params_local_1 = (Promise<void> *)params;
  params_local = (Canceler *)this;
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<void>::PromiseFulfiller((PromiseFulfiller<void> *)(this + 0x10));
  *(undefined ***)this = &PTR_onReady_007c6f48;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_007c6f90;
  ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)(this + 0x18));
  this[0x180] = (AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>)0x1;
  canceler = fwd<kj::Canceler&>((Canceler *)params_local_1);
  pPVar1 = fwd<kj::Promise<void>>(local_20);
  Promise<void>::Promise(&local_30,pPVar1);
  Canceler::AdapterImpl<void>::AdapterImpl
            ((AdapterImpl<void> *)(this + 0x188),(PromiseFulfiller<void> *)(this + 0x10),canceler,
             &local_30);
  Promise<void>::~Promise(&local_30);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}